

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-ring.c
# Opt level: O0

lws_ring * lws_ring_create(size_t element_len,size_t count,_func_void_void_ptr *destroy_element)

{
  void *pvVar1;
  lws_ring *ring;
  _func_void_void_ptr *destroy_element_local;
  size_t count_local;
  size_t element_len_local;
  
  element_len_local = (size_t)lws_realloc((void *)0x0,0x20,"ring create");
  if ((long *)element_len_local == (long *)0x0) {
    element_len_local = 0;
  }
  else {
    *(int *)(element_len_local + 0x10) = (int)count * (int)element_len;
    *(int *)(element_len_local + 0x14) = (int)element_len;
    *(undefined4 *)(element_len_local + 0x18) = 0;
    *(undefined4 *)(element_len_local + 0x1c) = 0;
    *(_func_void_void_ptr **)(element_len_local + 8) = destroy_element;
    pvVar1 = lws_realloc((void *)0x0,(ulong)*(uint *)(element_len_local + 0x10),"ring buf");
    *(void **)element_len_local = pvVar1;
    if (*(long *)element_len_local == 0) {
      lws_realloc((void *)element_len_local,0,"lws_free");
      element_len_local = 0;
    }
  }
  return (lws_ring *)element_len_local;
}

Assistant:

struct lws_ring *
lws_ring_create(size_t element_len, size_t count,
		void (*destroy_element)(void *))
{
	struct lws_ring *ring = lws_malloc(sizeof(*ring), "ring create");

	if (!ring)
		return NULL;

	ring->buflen = (uint32_t)(count * element_len);
	ring->element_len = (uint32_t)element_len;
	ring->head = 0;
	ring->oldest_tail = 0;
	ring->destroy_element = destroy_element;

	ring->buf = lws_malloc(ring->buflen, "ring buf");
	if (!ring->buf) {
		lws_free(ring);

		return NULL;
	}

	return ring;
}